

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportwriter.cpp
# Opt level: O3

void __thiscall ReportWriter::writeSavedResults(ReportWriter *this,OutputFile *outFile)

{
  int iVar1;
  int iVar2;
  ofstream *poVar3;
  long lVar4;
  long lVar5;
  pointer ppNVar6;
  Node *node;
  pointer ppLVar7;
  Link *link;
  int iVar8;
  long *plVar9;
  ostream *poVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar11;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  pointer ppNVar12;
  pointer ppLVar13;
  bool bVar14;
  undefined1 local_60 [8];
  string theTime;
  
  iVar1 = outFile->timePeriodCount;
  iVar2 = outFile->reportStep;
  OutputFile::seekNetworkOffset(outFile);
  if (0 < iVar1) {
    theTime.field_2._12_4_ = outFile->reportStart;
    uVar11 = extraout_RDX;
    iVar8 = 1;
    do {
      Utilities::getTime_abi_cxx11_
                ((string *)local_60,(Utilities *)(ulong)(uint)theTime.field_2._12_4_,(int)uVar11);
      if ((this->network->options).indexOptions[0xf] == 0) {
        OutputFile::skipNodeResults(outFile);
      }
      else {
        poVar3 = this->sout;
        lVar4 = *(long *)poVar3;
        lVar5 = *(long *)(lVar4 + -0x18);
        *(uint *)(poVar3 + lVar5 + 0x18) = *(uint *)(poVar3 + lVar5 + 0x18) & 0xffffff4f | 0x20;
        std::ios::widen((char)*(undefined8 *)(lVar4 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        plVar9 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
        std::ostream::put((char)plVar9);
        poVar10 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  Node Results at ",0x12);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,(char *)local_60,(long)theTime._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," hrs",4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        writeNodeHeader(this);
        ppNVar6 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                  .super__Vector_impl_data._M_finish;
        for (ppNVar12 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_start; ppNVar12 != ppNVar6;
            ppNVar12 = ppNVar12 + 1) {
          node = *ppNVar12;
          OutputFile::readNodeResults(outFile);
          writeNodeResults(this,node,outFile->nodeResults);
        }
      }
      if ((this->network->options).indexOptions[0x10] == 0) {
        OutputFile::skipLinkResults(outFile);
        uVar11 = extraout_RDX_02;
      }
      else {
        poVar3 = this->sout;
        lVar4 = *(long *)poVar3;
        lVar5 = *(long *)(lVar4 + -0x18);
        *(uint *)(poVar3 + lVar5 + 0x18) = *(uint *)(poVar3 + lVar5 + 0x18) & 0xffffff4f | 0x20;
        std::ios::widen((char)*(undefined8 *)(lVar4 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        plVar9 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
        std::ostream::put((char)plVar9);
        poVar10 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  Link Results at ",0x12);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,(char *)local_60,(long)theTime._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," hrs",4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        writeLinkHeader(this);
        ppLVar7 = (this->network->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl
                  .super__Vector_impl_data._M_finish;
        uVar11 = extraout_RDX_00;
        for (ppLVar13 = (this->network->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>.
                        _M_impl.super__Vector_impl_data._M_start; ppLVar13 != ppLVar7;
            ppLVar13 = ppLVar13 + 1) {
          link = *ppLVar13;
          OutputFile::readLinkResults(outFile);
          writeLinkResults(this,link,outFile->linkResults);
          uVar11 = extraout_RDX_01;
        }
      }
      if (local_60 != (undefined1  [8])&theTime._M_string_length) {
        operator_delete((void *)local_60);
        uVar11 = extraout_RDX_03;
      }
      theTime.field_2._12_4_ = theTime.field_2._12_4_ + iVar2;
      bVar14 = iVar8 != iVar1;
      iVar8 = iVar8 + 1;
    } while (bVar14);
  }
  return;
}

Assistant:

void ReportWriter::writeSavedResults(OutputFile* outFile)
{
    int nPeriods = outFile->timePeriodCount;
    int reportStep = outFile->reportStep;
    outFile->seekNetworkOffset();
    int t = outFile->reportStart;
    for (int i = 1; i <= nPeriods; i++)
    {
        string theTime = Utilities::getTime(t);

        if (network->option(Options::REPORT_NODES))
        {
            sout << left;
            sout << endl << endl << "  Node Results at " << theTime << " hrs" << endl;
            writeNodeHeader();
            for (Node* node : network->nodes)
            {
                outFile->readNodeResults();
                writeNodeResults(node, outFile->nodeResults);
            }
        }
        else outFile->skipNodeResults();

        if (network->option(Options::REPORT_LINKS))
        {
            sout << left;
            sout << endl << endl << "  Link Results at " << theTime << " hrs" << endl;
            writeLinkHeader();
            for (Link* link : network->links)
            {
                outFile->readLinkResults();
                writeLinkResults(link, outFile->linkResults);
            }
        }
        else outFile->skipLinkResults();

        t += reportStep;
    }
}